

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

AssertionExpr * __thiscall
slang::ast::ClockingAssertionExpr::fromSyntax
          (ClockingAssertionExpr *this,SignalEventExpressionSyntax *syntax,ASTContext *context)

{
  SyntaxNode *pSVar1;
  BumpAllocator *this_00;
  int iVar2;
  ClockingAssertionExpr *pCVar3;
  undefined4 extraout_var;
  InvalidAssertionExpr *args_1;
  SourceRange sourceRange;
  AssertionExpr *local_18;
  
  pSVar1 = (syntax->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.parent;
  if (pSVar1 != (SyntaxNode *)0x0) {
    this_00 = (BumpAllocator *)pSVar1->parent;
    if (((syntax->edge).field_0x2 & 0x10) == 0) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this);
      ASTContext::addDiag((ASTContext *)syntax,(DiagCode)0x210008,sourceRange);
      local_18 = (AssertionExpr *)0x0;
      pCVar3 = (ClockingAssertionExpr *)
               BumpAllocator::
               emplace<slang::ast::InvalidAssertionExpr,slang::ast::AssertionExpr_const*&>
                         (this_00,&local_18);
    }
    else {
      iVar2 = TimingControl::bind((int)this,(sockaddr *)syntax,(socklen_t)context);
      local_18 = (AssertionExpr *)0x0;
      args_1 = BumpAllocator::
               emplace<slang::ast::InvalidAssertionExpr,slang::ast::AssertionExpr_const*&>
                         (this_00,&local_18);
      pCVar3 = BumpAllocator::
               emplace<slang::ast::ClockingAssertionExpr,slang::ast::TimingControl&,slang::ast::AssertionExpr&>
                         (this_00,(TimingControl *)CONCAT44(extraout_var,iVar2),
                          &args_1->super_AssertionExpr);
    }
    return &pCVar3->super_AssertionExpr;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
            );
}

Assistant:

bool visitInvalid(const AssertionExpr&) { return false; }